

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.cc
# Opt level: O3

uint8_t __thiscall wabt::ElemSegment::GetFlags(ElemSegment *this,Module *module)

{
  SegmentKind SVar1;
  Enum EVar2;
  pointer pEVar3;
  byte bVar4;
  Index IVar5;
  pointer pEVar6;
  pointer pEVar7;
  long lVar8;
  long lVar9;
  
  SVar1 = this->kind;
  EVar2 = (this->elem_type).enum_;
  if (SVar1 == Declared) {
    bVar4 = 3;
  }
  else if (SVar1 == Passive) {
    bVar4 = 1;
  }
  else if (SVar1 == Active) {
    IVar5 = BindingHash::FindIndex(&module->table_bindings,&this->table_var);
    bVar4 = (IVar5 != 0) * '\x02';
  }
  else {
    bVar4 = 0;
  }
  if (EVar2 != FuncRef) goto LAB_00150174;
  pEVar6 = (this->elem_exprs).super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pEVar3 = (this->elem_exprs).super__Vector_base<wabt::ElemExpr,_std::allocator<wabt::ElemExpr>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar9 = (long)pEVar3 - (long)pEVar6;
  lVar8 = (lVar9 >> 3) * 0x2e8ba2e8ba2e8ba3 >> 2;
  if (0 < lVar8) {
    lVar9 = lVar8 + 1;
    pEVar7 = pEVar6 + 2;
    do {
      if (pEVar7[-2].kind != RefFunc) {
        pEVar7 = pEVar7 + -2;
        goto LAB_0015016f;
      }
      if (pEVar7[-1].kind != RefFunc) {
        pEVar7 = pEVar7 + -1;
        goto LAB_0015016f;
      }
      if (pEVar7->kind != RefFunc) goto LAB_0015016f;
      if (pEVar7[1].kind != RefFunc) {
        pEVar7 = pEVar7 + 1;
        goto LAB_0015016f;
      }
      lVar9 = lVar9 + -1;
      pEVar7 = pEVar7 + 4;
    } while (1 < lVar9);
    lVar9 = (long)pEVar3 - (long)(pEVar6 + lVar8 * 4);
    pEVar6 = pEVar6 + lVar8 * 4;
  }
  lVar8 = (lVar9 >> 3) * 0x2e8ba2e8ba2e8ba3;
  if (lVar8 == 1) {
LAB_00150150:
    pEVar7 = pEVar6;
    if (pEVar6->kind == RefFunc) {
      pEVar7 = pEVar3;
    }
  }
  else if (lVar8 == 2) {
LAB_00150147:
    pEVar7 = pEVar6;
    if (pEVar6->kind == RefFunc) {
      pEVar6 = pEVar6 + 1;
      goto LAB_00150150;
    }
  }
  else {
    if (lVar8 != 3) {
      return bVar4;
    }
    pEVar7 = pEVar6;
    if (pEVar6->kind == RefFunc) {
      pEVar6 = pEVar6 + 1;
      goto LAB_00150147;
    }
  }
LAB_0015016f:
  if (pEVar7 == pEVar3) {
    return bVar4;
  }
LAB_00150174:
  return bVar4 | 4;
}

Assistant:

uint8_t ElemSegment::GetFlags(const Module* module) const {
  uint8_t flags = 0;

  bool all_ref_func = elem_type == Type::FuncRef;

  switch (kind) {
    case SegmentKind::Active: {
      Index table_index = module->GetTableIndex(table_var);
      if (table_index != 0) {
        flags |= SegExplicitIndex;
      }
      break;
    }

    case SegmentKind::Passive:
      flags |= SegPassive;
      break;

    case SegmentKind::Declared:
      flags |= SegDeclared;
      break;
  }

  all_ref_func = all_ref_func &&
                 std::all_of(elem_exprs.begin(), elem_exprs.end(),
                             [](const ElemExpr& elem_expr) {
                               return elem_expr.kind == ElemExprKind::RefFunc;
                             });
  if (!all_ref_func) {
    flags |= SegUseElemExprs;
  }

  return flags;
}